

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O0

UBool __thiscall
icu_63::GNameSearchHandler::handleMatch
          (GNameSearchHandler *this,int32_t matchLength,CharacterNode *node,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  uint *puVar3;
  UVector *this_00;
  undefined8 *obj;
  size_t size;
  UVector *local_78;
  GMatchInfo *gmatch;
  GNameInfo *nameinfo;
  int32_t i;
  int32_t valuesCount;
  UErrorCode *status_local;
  CharacterNode *node_local;
  int32_t matchLength_local;
  GNameSearchHandler *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UVar1 = CharacterNode::hasValues(node);
    if (UVar1 != '\0') {
      iVar2 = CharacterNode::countValues(node);
      for (nameinfo._0_4_ = 0; (int)(uint)nameinfo < iVar2; nameinfo._0_4_ = (uint)nameinfo + 1) {
        size = (size_t)(uint)nameinfo;
        puVar3 = (uint *)CharacterNode::getValue(node,(uint)nameinfo);
        if (puVar3 == (uint *)0x0) break;
        if ((*puVar3 & this->fTypes) != 0) {
          if (this->fResults == (UVector *)0x0) {
            this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,size);
            local_78 = (UVector *)0x0;
            if (this_00 != (UVector *)0x0) {
              UVector::UVector(this_00,uprv_free_63,(UElementsAreEqual *)0x0,status);
              local_78 = this_00;
            }
            this->fResults = local_78;
            if (this->fResults == (UVector *)0x0) {
              *status = U_MEMORY_ALLOCATION_ERROR;
            }
          }
          UVar1 = ::U_SUCCESS(*status);
          if (UVar1 != '\0') {
            obj = (undefined8 *)uprv_malloc_63(0x10);
            if (obj == (undefined8 *)0x0) {
              *status = U_MEMORY_ALLOCATION_ERROR;
            }
            else {
              *obj = puVar3;
              *(int32_t *)(obj + 1) = matchLength;
              *(undefined4 *)((long)obj + 0xc) = 0;
              UVector::addElement(this->fResults,obj,status);
              UVar1 = ::U_FAILURE(*status);
              if (UVar1 == '\0') {
                if (this->fMaxMatchLen < matchLength) {
                  this->fMaxMatchLen = matchLength;
                }
              }
              else {
                uprv_free_63(obj);
              }
            }
          }
        }
      }
    }
    this_local._7_1_ = '\x01';
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool
GNameSearchHandler::handleMatch(int32_t matchLength, const CharacterNode *node, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return FALSE;
    }
    if (node->hasValues()) {
        int32_t valuesCount = node->countValues();
        for (int32_t i = 0; i < valuesCount; i++) {
            GNameInfo *nameinfo = (ZNameInfo *)node->getValue(i);
            if (nameinfo == NULL) {
                break;
            }
            if ((nameinfo->type & fTypes) != 0) {
                // matches a requested type
                if (fResults == NULL) {
                    fResults = new UVector(uprv_free, NULL, status);
                    if (fResults == NULL) {
                        status = U_MEMORY_ALLOCATION_ERROR;
                    }
                }
                if (U_SUCCESS(status)) {
                    U_ASSERT(fResults != NULL);
                    GMatchInfo *gmatch = (GMatchInfo *)uprv_malloc(sizeof(GMatchInfo));
                    if (gmatch == NULL) {
                        status = U_MEMORY_ALLOCATION_ERROR;
                    } else {
                        // add the match to the vector
                        gmatch->gnameInfo = nameinfo;
                        gmatch->matchLength = matchLength;
                        gmatch->timeType = UTZFMT_TIME_TYPE_UNKNOWN;
                        fResults->addElement(gmatch, status);
                        if (U_FAILURE(status)) {
                            uprv_free(gmatch);
                        } else {
                            if (matchLength > fMaxMatchLen) {
                                fMaxMatchLen = matchLength;
                            }
                        }
                    }
                }
            }
        }
    }
    return TRUE;
}